

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCases.cpp
# Opt level: O2

void Test7(void)

{
  CMReturn In;
  long lVar1;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  allocator_type local_221c;
  allocator<char> local_221b;
  undefined1 local_221a;
  undefined1 local_2219;
  unsigned_long local_2218 [3];
  undefined7 uStack_2200;
  undefined1 uStack_21f9;
  undefined7 uStack_21f8;
  uint64_t local_21e8;
  uint64_t uStack_21e0;
  CM_RETURN_STATUS local_21d8;
  undefined4 uStack_21d4;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_21c8;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_21b0;
  undefined1 local_2198;
  undefined7 uStack_2197;
  undefined1 uStack_2190;
  undefined7 uStack_218f;
  undefined1 uStack_2188;
  undefined7 uStack_2187;
  undefined8 uStack_2180;
  undefined8 local_2178;
  undefined8 uStack_2170;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2168;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  map;
  unsigned_long local_2120 [2];
  string local_2110;
  string local_20f0;
  string in;
  CMReturn res;
  string local_2090 [32];
  string local_2070 [32];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_2050;
  ConfusableMatcher matcher;
  
  GetDefaultMap_abi_cxx11_();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&in,anon_var_dwarf_15207,(allocator<char> *)&matcher);
  local_2218[2] = 0;
  uStack_2200 = 0;
  uStack_21f9 = 0;
  uStack_21f8 = 0;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(&local_2168,&map);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&res,"_",(allocator<char> *)local_2218);
  std::__cxx11::string::string<std::allocator<char>>(local_2090,"%",(allocator<char> *)local_2120);
  std::__cxx11::string::string<std::allocator<char>>(local_2070,"$",&local_221b);
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_2050,&res,&local_2050,0,&local_221c,&local_2219,&local_221a);
  ConfusableMatcher::ConfusableMatcher
            (&matcher,&local_2168,
             (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_2050,true);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_2050);
  lVar1 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&res.Start + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_2168);
  std::__cxx11::string::string((string *)&local_20f0,(string *)&in);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2110,"NIGGER",(allocator<char> *)local_2218);
  local_2198 = 1;
  uStack_2197 = (undefined7)local_2218[2];
  uStack_2190 = (undefined1)(local_2218[2] >> 0x38);
  uStack_218f = uStack_2200;
  uStack_2188 = uStack_21f9;
  uStack_2187 = uStack_21f8;
  uStack_2180 = 1000000;
  local_2178 = 0;
  uStack_2170 = 0;
  ConfusableMatcher::IndexOf
            (&res,&matcher,&local_20f0,&local_2110,
             (CMOptions)
             ZEXT3248(CONCAT824(1000000,CONCAT816(CONCAT71(uStack_21f8,uStack_21f9),
                                                  CONCAT88(CONCAT71(uStack_2200,uStack_2190),
                                                           CONCAT71(uStack_2197,1))))));
  std::__cxx11::string::~string((string *)&local_2110);
  std::__cxx11::string::~string((string *)&local_20f0);
  local_21d8 = res.Status;
  uStack_21d4 = res._20_4_;
  local_21e8 = res.Start;
  uStack_21e0 = res.Size;
  local_2218[0] = 0x40;
  local_2218[1] = 0x59;
  __l._M_len = 2;
  __l._M_array = local_2218;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_21b0,__l,
             (allocator_type *)&local_221b);
  local_2120[0] = 0x39;
  local_2120[1] = 0x20;
  __l_00._M_len = 2;
  __l_00._M_array = local_2120;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_21c8,__l_00,&local_221c
            );
  In.Size = uStack_21e0;
  In.Start = local_21e8;
  In.Status = local_21d8;
  In._20_4_ = uStack_21d4;
  AssertMatchMulti(In,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_21b0,
                   (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_21c8,MATCH);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_21c8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_21b0);
  ConfusableMatcher::~ConfusableMatcher(&matcher);
  std::__cxx11::string::~string((string *)&in);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&map);
  return;
}

Assistant:

void Test7()
{
	auto map = GetDefaultMap();

	std::string in = "AAAAAAAAASSAFSAFNFNFNISFNSIFSIFJSDFUDSHF ASUF/|/__/|/___%/|/%I%%/|//|/%%%%%NNNN/|/NN__/|/N__𝘪G___%____$__G__𝓰𝘦Ѓ";

	CMOptions opts = { };
	opts.TimeoutNs = 1000000;
	opts.MatchRepeating = true;
	auto matcher = ConfusableMatcher(map, { "_", "%", "$" });
	auto res = matcher.IndexOf(in, "NIGGER", opts);

	AssertMatchMulti(res, { 64, 89 }, { 57, 32 });
}